

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char **argv_local;
  int argc_local;
  
  BEGIN_TESTING((_func_void *)0x0);
  test_timetlv_decoding();
  test_timetlv_encoding_exact();
  test_timetlv_encoding_average();
  test_metric_decoding();
  test_metric_encoding_exact();
  test_metric_encoding_average();
  iVar1 = FINISH_TESTING();
  return iVar1;
}

Assistant:

int main(int argc __attribute__ ((unused)), char **argv __attribute__ ((unused))) {
  BEGIN_TESTING(NULL);

  test_timetlv_decoding();
  test_timetlv_encoding_exact();
  test_timetlv_encoding_average();

  test_metric_decoding();
  test_metric_encoding_exact();
  test_metric_encoding_average();

  return FINISH_TESTING();
}